

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O0

bool __thiscall CNetAddr::IsRFC6145(CNetAddr *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  bool local_21;
  prevector<16U,_unsigned_char,_unsigned_int,_int> *obj;
  
  obj = *(prevector<16U,_unsigned_char,_unsigned_int,_int> **)(in_FS_OFFSET + 0x28);
  bVar1 = IsIPv6((CNetAddr *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  local_21 = false;
  if (bVar1) {
    local_21 = util::HasPrefix<prevector<16u,unsigned_char,unsigned_int,int>,12ul>
                         (obj,(array<unsigned_char,_12UL> *)0xffff00000000);
  }
  if (*(prevector<16U,_unsigned_char,_unsigned_int,_int> **)(in_FS_OFFSET + 0x28) != obj) {
    __stack_chk_fail();
  }
  return local_21;
}

Assistant:

bool CNetAddr::IsRFC6145() const
{
    return IsIPv6() &&
           HasPrefix(m_addr, std::array<uint8_t, 12>{0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
                                                     0x00, 0x00, 0xFF, 0xFF, 0x00, 0x00});
}